

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O3

ssize_t tester_mq_receive(mqd_t tester_mq,tester_mq_msg *msg,_Bool *err)

{
  long lVar1;
  size_t __msg_len;
  ssize_t sVar2;
  undefined8 uStack_40;
  char acStack_38 [8];
  
  uStack_40 = 0x102300;
  __msg_len = tester_mq_get_buffsize(tester_mq,err);
  if (*err == true) {
    *err = true;
    uStack_40 = 0x102326;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                  ,"tester_mq_receive");
    sVar2 = -1;
  }
  else {
    lVar1 = -(__msg_len + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x102356;
    sVar2 = mq_receive(tester_mq,acStack_38 + lVar1,__msg_len,(uint *)0x0);
    if (sVar2 < 1) {
      *err = true;
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x102390;
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                    ,"tester_mq_receive");
      sVar2 = -1;
    }
    else {
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10236e;
      memcpy(msg,acStack_38 + lVar1,0x400);
    }
  }
  return sVar2;
}

Assistant:

ssize_t tester_mq_receive(mqd_t tester_mq, tester_mq_msg *msg, bool *err) {
    assert(msg != NULL && err != NULL);

    size_t buffsize = tester_mq_get_buffsize(tester_mq, err);
    INT_FAIL_IF(*err);

    char buff[buffsize];
    ssize_t request_ret = mq_receive(tester_mq, buff, buffsize, NULL);
    INT_FAIL_IF(request_ret <= 0);

    memcpy(msg, buff, sizeof(tester_mq_msg));
    return request_ret;
}